

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O2

void __thiscall
NormalMutexTest_TryLock_Test<yamc::checked::mutex>::NormalMutexTest_TryLock_Test
          (NormalMutexTest_TryLock_Test<yamc::checked::mutex> *this)

{
  NormalMutexTest<yamc::checked::mutex>::NormalMutexTest
            (&this->super_NormalMutexTest<yamc::checked::mutex>);
  (this->super_NormalMutexTest<yamc::checked::mutex>).super_Test._vptr_Test =
       (_func_int **)&PTR__Test_0026f478;
  return;
}

Assistant:

TYPED_TEST(NormalMutexTest, TryLock)
{
  TypeParam mtx;
  std::size_t counter = 0;
  yamc::test::task_runner(
    TEST_THREADS,
    [&](std::size_t /*id*/) {
      for (std::size_t n = 0; n < TEST_ITERATION; ++n) {
        while (!mtx.try_lock()) {
          std::this_thread::yield();
        }
        std::lock_guard<TypeParam> lk(mtx, std::adopt_lock);
        counter = counter + 1;
        std::this_thread::yield();  // provoke lock contention
      }
    });
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, counter);
}